

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O3

bool __thiscall
draco::PlyDecoder::ReadPropertiesToAttribute<float>
          (PlyDecoder *this,
          vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
          *properties,PointAttribute *attribute,int num_vertices)

{
  size_t __n;
  PlyPropertyReader<float> *pPVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  size_type __n_00;
  ulong uVar5;
  pointer ppPVar6;
  float fVar7;
  vector<float,_std::allocator<float>_> memory;
  vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  readers;
  int local_6c;
  vector<float,_std::allocator<float>_> local_68;
  uint local_4c;
  vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c = num_vertices;
  std::
  vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  ::reserve(&local_48,
            (long)(properties->
                  super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(properties->
                  super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3);
  ppPVar6 = (properties->
            super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((properties->
      super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>).
      _M_impl.super__Vector_impl_data._M_finish == ppPVar6) {
    __n_00 = 0;
  }
  else {
    uVar3 = 0;
    do {
      pPVar1 = (PlyPropertyReader<float> *)operator_new(0x28);
      PlyPropertyReader<float>::PlyPropertyReader(pPVar1,ppPVar6[uVar3]);
      local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)pPVar1;
      std::
      vector<std::unique_ptr<draco::PlyPropertyReader<float>,std::default_delete<draco::PlyPropertyReader<float>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,std::default_delete<draco::PlyPropertyReader<float>>>>>
      ::
      emplace_back<std::unique_ptr<draco::PlyPropertyReader<float>,std::default_delete<draco::PlyPropertyReader<float>>>>
                ((vector<std::unique_ptr<draco::PlyPropertyReader<float>,std::default_delete<draco::PlyPropertyReader<float>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,std::default_delete<draco::PlyPropertyReader<float>>>>>
                  *)&local_48,
                 (unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>
                  *)&local_68);
      if ((PlyPropertyReader<float> *)
          local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (PlyPropertyReader<float> *)0x0) {
        std::default_delete<draco::PlyPropertyReader<float>_>::operator()
                  ((default_delete<draco::PlyPropertyReader<float>_> *)&local_68,
                   (PlyPropertyReader<float> *)
                   local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start);
      }
      uVar3 = uVar3 + 1;
      ppPVar6 = (properties->
                super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      __n_00 = (long)(properties->
                     super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar6 >> 3;
    } while (uVar3 < __n_00);
  }
  std::vector<float,_std::allocator<float>_>::vector(&local_68,__n_00,(allocator_type *)&local_6c);
  if (local_4c != 0) {
    uVar3 = (ulong)local_4c;
    uVar5 = 0;
    do {
      if ((properties->
          super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
          )._M_impl.super__Vector_impl_data._M_finish !=
          (properties->
          super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        uVar4 = 0;
        do {
          pPVar1 = local_48.
                   super__Vector_base<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t.
                   super___uniq_ptr_impl<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::PlyPropertyReader<float>_*,_std::default_delete<draco::PlyPropertyReader<float>_>_>
                   .super__Head_base<0UL,_draco::PlyPropertyReader<float>_*,_false>._M_head_impl;
          local_6c = (int)uVar5;
          if (*(_Manager_type *)((long)&(pPVar1->convert_value_func_).super__Function_base + 0x10)
              == (_Manager_type)0x0) {
            uVar2 = std::__throw_bad_function_call();
            std::
            vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
            ::~vector(&local_48);
            _Unwind_Resume(uVar2);
          }
          fVar7 = (*(pPVar1->convert_value_func_)._M_invoker)
                            ((_Any_data *)&pPVar1->convert_value_func_,&local_6c);
          *(float *)((long)(PlyProperty **)
                           local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar4 * 4) = fVar7;
          uVar4 = uVar4 + 1;
        } while (uVar4 < (ulong)((long)(properties->
                                       super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(properties->
                                       super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      __n = (attribute->super_GeometryAttribute).byte_stride_;
      memcpy((void *)(__n * uVar5 +
                     (long)(((attribute->super_GeometryAttribute).buffer_)->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start),
             local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,__n);
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar3);
  }
  if ((PlyPropertyReader<float> *)
      local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (PlyPropertyReader<float> *)0x0) {
    operator_delete(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  ::~vector(&local_48);
  return true;
}

Assistant:

bool PlyDecoder::ReadPropertiesToAttribute(
    const std::vector<const PlyProperty *> &properties,
    PointAttribute *attribute, int num_vertices) {
  std::vector<std::unique_ptr<PlyPropertyReader<DataTypeT>>> readers;
  readers.reserve(properties.size());
  for (int prop = 0; prop < properties.size(); ++prop) {
    readers.push_back(std::unique_ptr<PlyPropertyReader<DataTypeT>>(
        new PlyPropertyReader<DataTypeT>(properties[prop])));
  }
  std::vector<DataTypeT> memory(properties.size());
  for (PointIndex::ValueType i = 0; i < static_cast<uint32_t>(num_vertices);
       ++i) {
    for (int prop = 0; prop < properties.size(); ++prop) {
      memory[prop] = readers[prop]->ReadValue(i);
    }
    attribute->SetAttributeValue(AttributeValueIndex(i), memory.data());
  }
  return true;
}